

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

void __thiscall
testing::internal::
FunctionMockerBase<TestResult_(mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)53,_(mp::expr::Kind)58>)>
::FunctionMockerBase
          (FunctionMockerBase<TestResult_(mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)53,_(mp::expr::Kind)58>)>
           *this)

{
  UntypedFunctionMockerBase::UntypedFunctionMockerBase(&this->super_UntypedFunctionMockerBase);
  (this->super_UntypedFunctionMockerBase)._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_001ca320;
  (this->current_spec_).function_mocker_ = this;
  (this->current_spec_).matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)53,_(mp::expr::Kind)58>_>_>
  .
  super__Head_base<0UL,_testing::Matcher<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)53,_(mp::expr::Kind)58>_>,_false>
  ._M_head_impl.
  super_MatcherBase<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)53,_(mp::expr::Kind)58>_>
  .impl_.value_ =
       (MatcherInterface<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)53,_(mp::expr::Kind)58>_>
        *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->current_spec_).matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)53,_(mp::expr::Kind)58>_>_>
          .
          super__Head_base<0UL,_testing::Matcher<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)53,_(mp::expr::Kind)58>_>,_false>
          ._M_head_impl.
          super_MatcherBase<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)53,_(mp::expr::Kind)58>_>
          .impl_ + 8))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->current_spec_).matchers_.
               super__Tuple_impl<0UL,_testing::Matcher<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)53,_(mp::expr::Kind)58>_>_>
               .
               super__Head_base<0UL,_testing::Matcher<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)53,_(mp::expr::Kind)58>_>,_false>
               ._M_head_impl.
               super_MatcherBase<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)53,_(mp::expr::Kind)58>_>
               .impl_ + 8);
  (this->current_spec_).matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)53,_(mp::expr::Kind)58>_>_>
  .
  super__Head_base<0UL,_testing::Matcher<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)53,_(mp::expr::Kind)58>_>,_false>
  ._M_head_impl.
  super_MatcherBase<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)53,_(mp::expr::Kind)58>_>
  ._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_001ca370;
  return;
}

Assistant:

FunctionMockerBase() : current_spec_(this) {}